

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_keytrans.cpp
# Opt level: O0

int put_string(char *dest,char *news,int where)

{
  int iVar1;
  size_t sVar2;
  int local_28;
  int local_24;
  int cnt;
  int i;
  int len;
  int where_local;
  char *news_local;
  char *dest_local;
  
  sVar2 = strlen(news);
  iVar1 = (int)sVar2;
  local_24 = where;
  for (local_28 = 0; local_28 < iVar1; local_28 = local_28 + 1) {
    dest[local_24] = news[local_28];
    local_24 = local_24 + 1;
  }
  dest[where + iVar1] = '\0';
  return where + iVar1;
}

Assistant:

int
put_string(char *dest, const char *news, int where)
{
  int len = strlen(news);
  int i, cnt;
  for (i = where, cnt = 0; cnt < len; i++, cnt++)
    dest[i] = news[cnt];
  dest[where + len] = 0; //string terminator
  return where + len;    // index of the 0
}